

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.c
# Opt level: O0

lzma_index * lzma_index_dup(lzma_index *src,lzma_allocator *allocator)

{
  index_stream *node;
  lzma_index *dest;
  index_stream *deststream;
  index_stream *srcstream;
  lzma_allocator *allocator_local;
  lzma_index *src_local;
  
  src_local = index_init_plain(allocator);
  if (src_local == (lzma_index *)0x0) {
    src_local = (lzma_index *)0x0;
  }
  else {
    src_local->uncompressed_size = src->uncompressed_size;
    src_local->total_size = src->total_size;
    src_local->record_count = src->record_count;
    src_local->index_list_size = src->index_list_size;
    deststream = (index_stream *)(src->streams).leftmost;
    do {
      node = index_dup_stream(deststream,allocator);
      if (node == (index_stream *)0x0) {
        lzma_index_end(src_local,allocator);
        return (lzma_index *)0x0;
      }
      index_tree_append(&src_local->streams,&node->node);
      deststream = (index_stream *)index_tree_next(&deststream->node);
    } while (deststream != (index_stream *)0x0);
  }
  return src_local;
}

Assistant:

extern LZMA_API(lzma_index *)
lzma_index_dup(const lzma_index *src, lzma_allocator *allocator)
{
	index_stream *srcstream;
	index_stream *deststream;

	// Allocate the base structure (no initial Stream).
	lzma_index *dest = index_init_plain(allocator);
	if (dest == NULL)
		return NULL;

	// Copy the totals.
	dest->uncompressed_size = src->uncompressed_size;
	dest->total_size = src->total_size;
	dest->record_count = src->record_count;
	dest->index_list_size = src->index_list_size;

	// Copy the Streams and the groups in them.
	srcstream = (index_stream *)(src->streams.leftmost);
	do {
		deststream = index_dup_stream(srcstream, allocator);
		if (deststream == NULL) {
			lzma_index_end(dest, allocator);
			return NULL;
		}

		index_tree_append(&dest->streams, &deststream->node);

		srcstream = index_tree_next(&srcstream->node);
	} while (srcstream != NULL);

	return dest;
}